

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (rt_expression_interface<double> *param_1,undefined8 param_2)

{
  expression_not_differentiable_exception *this;
  allocator<char> local_41;
  string local_40;
  undefined8 local_20;
  rt_expression_interface<double> *param_2_local;
  rt_expression_interface<double> *param_0_local;
  
  local_20 = param_2;
  param_2_local = param_1;
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"modulus operation not differentiable!",&local_41);
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_40);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_fabs<NumericT>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("modulus operation not differentiable!");
    return NULL;  //TODO: Think about returning a piecewise function here?
  }